

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O3

void compress_table(s3ssid_t *uncomp_tab,s3ssid_t *com_tab,s3cipid_t *ci_map,int32 n_ci)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < n_ci) {
    uVar1 = 0;
    do {
      com_tab[uVar1] = 0xffff;
      ci_map[uVar1] = -1;
      uVar1 = uVar1 + 1;
    } while ((uint)n_ci != uVar1);
    if (0 < n_ci) {
      uVar1 = 0;
      do {
        uVar3 = 0;
        if (uVar1 != 0) {
          uVar2 = 0;
          do {
            uVar3 = uVar2;
            if (com_tab[uVar2] == 0xffff) break;
            if (uncomp_tab[uVar1] == com_tab[uVar2]) goto LAB_001228bb;
            uVar2 = uVar2 + 1;
            uVar3 = uVar1;
          } while (uVar1 != uVar2);
        }
        com_tab[uVar3 & 0xffffffff] = uncomp_tab[uVar1];
LAB_001228bb:
        ci_map[uVar1] = (s3cipid_t)uVar3;
        uVar1 = uVar1 + 1;
      } while (uVar1 != (uint)n_ci);
    }
  }
  return;
}

Assistant:

void
compress_table(s3ssid_t * uncomp_tab, s3ssid_t * com_tab,
               s3cipid_t * ci_map, int32 n_ci)
{
    int32 found;
    int32 r;
    int32 tmp_r;

    for (r = 0; r < n_ci; r++) {
        com_tab[r] = BAD_S3SSID;
        ci_map[r] = BAD_S3CIPID;
    }
    /** Compress this map */
    for (r = 0; r < n_ci; r++) {

        found = 0;
        for (tmp_r = 0; tmp_r < r && com_tab[tmp_r] != BAD_S3SSID; tmp_r++) {   /* If it appears before, just filled in cimap; */
            if (uncomp_tab[r] == com_tab[tmp_r]) {
                found = 1;
                ci_map[r] = tmp_r;
                break;
            }
        }

        if (found == 0) {
            com_tab[tmp_r] = uncomp_tab[r];
            ci_map[r] = tmp_r;
        }
    }
}